

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O0

bool tyti::stl::read<float>(basic_solid<float> *out,string *fileName)

{
  bool bVar1;
  long lVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  fpos local_260 [32];
  string local_240 [8];
  string str;
  ifstream f;
  string *fileName_local;
  basic_solid<float> *out_local;
  
  std::ifstream::ifstream(&str.field_2._M_allocated_capacity + 1,(string *)fileName,_S_bin);
  std::__cxx11::string::string(local_240);
  std::istream::seekg((long)(&str.field_2._M_allocated_capacity + 1),_S_beg);
  local_260._0_16_ = std::istream::tellg();
  std::fpos::operator_cast_to_long(local_260);
  std::__cxx11::string::resize((ulong)local_240);
  std::istream::seekg((long)((long)&str.field_2 + 8),_S_beg);
  lVar2 = std::__cxx11::string::operator[]((ulong)local_240);
  std::__cxx11::string::size();
  std::istream::read(str.field_2._M_local_buf + 8,lVar2);
  std::ifstream::close();
  begin._M_current = (char *)std::__cxx11::string::cbegin();
  end._M_current = (char *)std::__cxx11::string::cend();
  bVar1 = read<float,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(out,begin,end);
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream((void *)((long)&str.field_2 + 8));
  return bVar1;
}

Assistant:

inline bool read(basic_solid<T>& out, const std::string& fileName)
        {
            std::ifstream f(fileName, std::ios::binary);
            std::string str;
            f.seekg(0, std::ios::end);
            str.resize((unsigned)f.tellg());
            f.seekg(0, std::ios::beg);
            f.read(&str[0], str.size());
            f.close();

            return read<T>(out, str.cbegin(), str.cend());
        }